

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y,int m)

{
  size_t __size;
  _generic_N_Vector_Ops *p_Var1;
  ulong uVar2;
  SUNNonlinearSolver NLS;
  _generic_SUNNonlinearSolver_Ops *__ptr;
  void *__ptr_00;
  N_Vector p_Var3;
  void *pvVar4;
  N_Vector *pp_Var5;
  int m_1;
  
  if ((((y != (N_Vector)0x0) && (p_Var1 = y->ops, p_Var1->nvclone != (_func_N_Vector_N_Vector *)0x0)
       ) && (p_Var1->nvdestroy != (_func_void_N_Vector *)0x0)) &&
     (((p_Var1->nvscale != (_func_void_realtype_N_Vector_N_Vector *)0x0 &&
       (p_Var1->nvlinearsum != (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0)) &&
      (p_Var1->nvdotprod != (_func_realtype_N_Vector_N_Vector *)0x0)))) {
    uVar2 = (ulong)(uint)m;
    NLS = (SUNNonlinearSolver)malloc(0x10);
    if (NLS != (SUNNonlinearSolver)0x0) {
      __ptr = (_generic_SUNNonlinearSolver_Ops *)malloc(0x68);
      if (__ptr != (_generic_SUNNonlinearSolver_Ops *)0x0) {
        __ptr_00 = calloc(1,0x98);
        if (__ptr_00 != (void *)0x0) {
          NLS->content = __ptr_00;
          NLS->ops = __ptr;
          __ptr->gettype = SUNNonlinSolGetType_FixedPoint;
          __ptr->initialize = SUNNonlinSolInitialize_FixedPoint;
          __ptr->setup = (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0;
          __ptr->solve = SUNNonlinSolSolve_FixedPoint;
          __ptr->free = SUNNonlinSolFree_FixedPoint;
          __ptr->setsysfn = SUNNonlinSolSetSysFn_FixedPoint;
          __ptr->setlsetupfn = (_func_int_SUNNonlinearSolver_SUNNonlinSolLSetupFn *)0x0;
          __ptr->setlsolvefn = (_func_int_SUNNonlinearSolver_SUNNonlinSolLSolveFn *)0x0;
          __ptr->setctestfn = SUNNonlinSolSetConvTestFn_FixedPoint;
          __ptr->setmaxiters = SUNNonlinSolSetMaxIters_FixedPoint;
          __ptr->getnumiters = SUNNonlinSolGetNumIters_FixedPoint;
          __ptr->getcuriter = SUNNonlinSolGetCurIter_FixedPoint;
          __ptr->getnumconvfails = SUNNonlinSolGetNumConvFails_FixedPoint;
          *(int *)((long)__ptr_00 + 0x10) = m;
          *(undefined4 *)((long)__ptr_00 + 0x84) = 3;
          p_Var3 = N_VClone(y);
          *(N_Vector *)((long)__ptr_00 + 0x58) = p_Var3;
          if (p_Var3 != (N_Vector)0x0) {
            p_Var3 = N_VClone(y);
            *(N_Vector *)((long)__ptr_00 + 0x60) = p_Var3;
            if (p_Var3 != (N_Vector)0x0) {
              p_Var3 = N_VClone(y);
              *(N_Vector *)((long)__ptr_00 + 0x78) = p_Var3;
              if (p_Var3 != (N_Vector)0x0) {
                if (m < 1) {
                  return NLS;
                }
                p_Var3 = N_VClone(y);
                *(N_Vector *)((long)__ptr_00 + 0x68) = p_Var3;
                if (p_Var3 != (N_Vector)0x0) {
                  p_Var3 = N_VClone(y);
                  *(N_Vector *)((long)__ptr_00 + 0x70) = p_Var3;
                  if (p_Var3 != (N_Vector)0x0) {
                    pvVar4 = malloc(uVar2 * 4);
                    *(void **)((long)__ptr_00 + 0x18) = pvVar4;
                    if (pvVar4 != (void *)0x0) {
                      pvVar4 = malloc((ulong)(uint)(m * m) << 3);
                      *(void **)((long)__ptr_00 + 0x20) = pvVar4;
                      if (pvVar4 != (void *)0x0) {
                        pvVar4 = malloc(uVar2 * 8);
                        *(void **)((long)__ptr_00 + 0x28) = pvVar4;
                        if (pvVar4 != (void *)0x0) {
                          __size = uVar2 * 8 + 8;
                          pvVar4 = malloc(__size);
                          *(void **)((long)__ptr_00 + 0x30) = pvVar4;
                          if (pvVar4 != (void *)0x0) {
                            pp_Var5 = N_VCloneVectorArray(m,y);
                            *(N_Vector **)((long)__ptr_00 + 0x38) = pp_Var5;
                            if (pp_Var5 != (N_Vector *)0x0) {
                              pp_Var5 = N_VCloneVectorArray(m,y);
                              *(N_Vector **)((long)__ptr_00 + 0x40) = pp_Var5;
                              if (pp_Var5 != (N_Vector *)0x0) {
                                pp_Var5 = N_VCloneVectorArray(m,y);
                                *(N_Vector **)((long)__ptr_00 + 0x48) = pp_Var5;
                                if (pp_Var5 != (N_Vector *)0x0) {
                                  pvVar4 = malloc(__size);
                                  *(void **)((long)__ptr_00 + 0x50) = pvVar4;
                                  if (pvVar4 != (void *)0x0) {
                                    return NLS;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          FreeContent(NLS);
          free(__ptr_00);
        }
        free(__ptr);
      }
      free(NLS);
    }
  }
  return (SUNNonlinearSolver)0x0;
}

Assistant:

SUNNonlinearSolver SUNNonlinSol_FixedPoint(N_Vector y, int m)
{
  SUNNonlinearSolver NLS;
  SUNNonlinearSolver_Ops ops;
  SUNNonlinearSolverContent_FixedPoint content;
  int retval;

  /* Check that the supplied N_Vector is non-NULL */
  if (y == NULL) return(NULL);

  /* Check that the supplied N_Vector supports all required operations */
  if ( (y->ops->nvclone     == NULL) ||
       (y->ops->nvdestroy   == NULL) ||
       (y->ops->nvscale     == NULL) ||
       (y->ops->nvlinearsum == NULL) ||
       (y->ops->nvdotprod   == NULL) )
    return(NULL);

  /* Create nonlinear linear solver */
  NLS = NULL;
  NLS = (SUNNonlinearSolver) malloc(sizeof *NLS);
  if (NLS == NULL) return(NULL);

  /* Create nonlinear solver operations structure */
  ops = NULL;
  ops = (SUNNonlinearSolver_Ops) malloc(sizeof *ops);
  if (ops == NULL) { free(NLS); return(NULL); }

  /* Create nonlinear solver content structure */
  content = NULL;
  content = (SUNNonlinearSolverContent_FixedPoint) malloc(sizeof *content);
  if (content == NULL) { free(ops); free(NLS); return(NULL); }

  /* Attach content and ops */
  NLS->content = content;
  NLS->ops     = ops;

  /* Attach operations */
  ops->gettype         = SUNNonlinSolGetType_FixedPoint;
  ops->initialize      = SUNNonlinSolInitialize_FixedPoint;
  ops->setup           = NULL;  /* no setup needed */
  ops->solve           = SUNNonlinSolSolve_FixedPoint;
  ops->free            = SUNNonlinSolFree_FixedPoint;
  ops->setsysfn        = SUNNonlinSolSetSysFn_FixedPoint;
  ops->setlsetupfn     = NULL;  /* no lsetup needed */
  ops->setlsolvefn     = NULL;  /* no lsolve needed */
  ops->setctestfn      = SUNNonlinSolSetConvTestFn_FixedPoint;
  ops->setmaxiters     = SUNNonlinSolSetMaxIters_FixedPoint;
  ops->getnumiters     = SUNNonlinSolGetNumIters_FixedPoint;
  ops->getcuriter      = SUNNonlinSolGetCurIter_FixedPoint;
  ops->getnumconvfails = SUNNonlinSolGetNumConvFails_FixedPoint;

  /* Initialize all components of content to 0/NULL */
  memset(content, 0, sizeof(struct _SUNNonlinearSolverContent_FixedPoint));

  /* Fill general content */
  content->Sys        = NULL;
  content->CTest      = NULL;
  content->m          = m;
  content->curiter    = 0;
  content->maxiters   = 3;
  content->niters     = 0;
  content->nconvfails = 0;

  /* Fill allocatable content */
  retval = AllocateContent(NLS, y);

  if (retval != SUN_NLS_SUCCESS) {
    NLS->content = NULL;
    NLS->ops = NULL;
    free(content);
    free(ops);
    free(NLS);
    return(NULL);
  }

  return(NLS);
}